

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

void bsp_init(_func_void *spmd_part,int argc,char **argv)

{
  Spmd *pSVar1;
  bool bVar2;
  int local_28;
  int local_24;
  int mpi_init;
  int pid;
  char **argv_local;
  _func_void *p_Stack_10;
  int argc_local;
  _func_void *spmd_part_local;
  
  local_24 = -1;
  local_28 = 0;
  _mpi_init = argv;
  argv_local._4_4_ = argc;
  p_Stack_10 = spmd_part;
  MPI_Initialized(&local_28);
  if (local_28 == 0) {
    MPI_Init((long)&argv_local + 4,&mpi_init);
    atexit(bsp_check_exit);
  }
  if (s_spmd != (Spmd *)0x0) {
    bsp_abort("bsp_init: May be called only once\n");
  }
  if (p_Stack_10 == (_func_void *)0x0) {
    bsp_abort("bsp_init: Pointer to function must not point to NULL\n");
  }
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_24);
  if (0 < local_24) {
    (*p_Stack_10)();
    if (s_spmd == (Spmd *)0x0) {
      bsp_abort("bsp_init: spmd function did not contain SPMD section\n");
    }
    bVar2 = bsplib::Spmd::closed(s_spmd);
    if (!bVar2) {
      bsp_abort("bsp_init: spmd function did not end with call to bsp_end\n");
    }
    pSVar1 = s_spmd;
    if (s_spmd != (Spmd *)0x0) {
      bsplib::Spmd::~Spmd(s_spmd);
      operator_delete(pSVar1,0x28);
    }
    s_spmd = (Spmd *)0x0;
    exit(0);
  }
  return;
}

Assistant:

void bsp_init( void (*spmd_part)(void), int argc, char *argv[])
{
    int pid = -1;
    int mpi_init = 0;
    MPI_Initialized(&mpi_init);
    if (!mpi_init) {
        MPI_Init(&argc, &argv);
        atexit( bsp_check_exit );
    }

    if (s_spmd)
        bsp_abort( "bsp_init: May be called only once\n" );

    if (!spmd_part)
        bsp_abort( "bsp_init: Pointer to function must not point to NULL\n");

    MPI_Comm_rank( MPI_COMM_WORLD, &pid );
    if (pid > 0) {
        (*spmd_part)();

        if (!s_spmd)
            bsp_abort("bsp_init: spmd function did not contain SPMD section\n");

        if (!s_spmd->closed())
            bsp_abort("bsp_init: spmd function did not end with call to bsp_end\n");

        delete s_spmd;
        s_spmd = NULL;
        std::exit(EXIT_SUCCESS);
    }
}